

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

void __thiscall soplex::SPxDevexPR<double>::addedCoVecs(SPxDevexPR<double> *this,int n)

{
  Type TVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  VectorBase<double> *in_RDI;
  double dVar5;
  VectorBase<double> *unaff_retaddr;
  int i;
  VectorBase<double> *coWeights;
  int initval;
  int local_1c;
  VectorBase<double> *pVVar6;
  
  pVVar6 = in_RDI;
  TVar1 = SPxSolverBase<double>::type
                    ((SPxSolverBase<double> *)
                     (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  iVar4 = 1;
  if (TVar1 == ENTER) {
    iVar4 = 2;
  }
  iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2dffb4);
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2dffd2);
  VectorBase<double>::reDim
            (unaff_retaddr,(int)((ulong)pVVar6 >> 0x20),SUB81((ulong)pVVar6 >> 0x18,0));
  local_1c = VectorBase<double>::dim((VectorBase<double> *)0x2dffed);
  while (local_1c = local_1c + -1, iVar2 <= local_1c) {
    dVar5 = (double)iVar4;
    pdVar3 = VectorBase<double>::operator[](in_RDI,(int)((ulong)dVar5 >> 0x20));
    *pdVar3 = dVar5;
  }
  return;
}

Assistant:

void SPxDevexPR<R>::addedCoVecs(int n)
{
   int initval = (this->thesolver->type() == SPxSolverBase<R>::ENTER) ? 2 : 1;
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   n = coWeights.dim();
   coWeights.reDim(this->thesolver->dim());

   for(int i = coWeights.dim() - 1; i >= n; --i)
      coWeights[i] = initval;
}